

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void __thiscall
embree::TutorialBenchmark::registerBenchmark
          (TutorialBenchmark *this,string *name,int argc,char **argv)

{
  ostream *poVar1;
  BenchState benchState;
  BenchState BStack_28;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"BENCHMARK SCENE: ");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar1);
  (*this->func)(&BStack_28,&this->params,argc,argv);
  return;
}

Assistant:

void TutorialBenchmark::registerBenchmark(std::string const& name, int argc, char** argv)
{
#ifdef USE_GOOGLE_BENCHMARK
  if (params.legacy) {
    std::cout << "BENCHMARK SCENE: " << name << std::endl;
    BenchState benchState;
    func(benchState, params, argc, argv);
  }
  else {
    ::benchmark::RegisterBenchmark(name.c_str(), callBenchFunc, argc, argv, params, func)->Unit(::benchmark::TimeUnit::kMillisecond);
  }
#else
  std::cout << "BENCHMARK SCENE: " << name << std::endl;
  BenchState benchState;
  func(benchState, params, argc, argv);
#endif
}